

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_Duplicate(cJSON *item,cJSON_bool recurse)

{
  char *pcVar1;
  cJSON *item_00;
  size_t sVar2;
  char *pcVar3;
  cJSON *pcVar4;
  long lVar5;
  cJSON *item_01;
  cJSON *pcVar6;
  
  if (item == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  item_00 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item_00 == (cJSON *)0x0) {
    return (cJSON *)0x0;
  }
  item_00->valuedouble = 0.0;
  item_00->string = (char *)0x0;
  item_00->valuestring = (char *)0x0;
  *(undefined8 *)&item_00->valueint = 0;
  item_00->child = (cJSON *)0x0;
  *(undefined8 *)&item_00->type = 0;
  item_00->next = (cJSON *)0x0;
  item_00->prev = (cJSON *)0x0;
  item_00->type = item->type & 0xfffffeff;
  item_00->valueint = item->valueint;
  item_00->valuedouble = item->valuedouble;
  pcVar1 = item->valuestring;
  if (pcVar1 == (char *)0x0) {
LAB_0010426f:
    pcVar1 = item->string;
    if (pcVar1 != (char *)0x0) {
      pcVar3 = pcVar1;
      if ((item->type & 0x200) == 0) {
        sVar2 = strlen(pcVar1);
        pcVar3 = (char *)(*global_hooks.allocate)(sVar2 + 1);
        if (pcVar3 == (char *)0x0) {
          lVar5 = 0x38;
          goto LAB_00104300;
        }
        memcpy(pcVar3,pcVar1,sVar2 + 1);
      }
      item_00->string = pcVar3;
    }
    if (recurse == 0) {
      return item_00;
    }
    item_01 = item->child;
    if (item_01 == (cJSON *)0x0) {
      return item_00;
    }
    pcVar6 = (cJSON *)0x0;
    while (pcVar4 = cJSON_Duplicate(item_01,1), pcVar4 != (cJSON *)0x0) {
      if (pcVar6 == (cJSON *)0x0) {
        item_00->child = pcVar4;
      }
      else {
        pcVar6->next = pcVar4;
        pcVar4->prev = pcVar6;
      }
      item_01 = item_01->next;
      pcVar6 = pcVar4;
      if (item_01 == (cJSON *)0x0) {
        return item_00;
      }
    }
  }
  else {
    sVar2 = strlen(pcVar1);
    pcVar3 = (char *)(*global_hooks.allocate)(sVar2 + 1);
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,pcVar1,sVar2 + 1);
      item_00->valuestring = pcVar3;
      goto LAB_0010426f;
    }
    lVar5 = 0x20;
LAB_00104300:
    *(undefined8 *)((long)&item_00->next + lVar5) = 0;
  }
  cJSON_Delete(item_00);
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_Duplicate(const cJSON *item, cJSON_bool recurse)
{
    cJSON *newitem = NULL;
    cJSON *child = NULL;
    cJSON *next = NULL;
    cJSON *newchild = NULL;

    /* Bail on bad ptr */
    if (!item)
    {
        goto fail;
    }
    /* Create new item */
    newitem = cJSON_New_Item(&global_hooks);
    if (!newitem)
    {
        goto fail;
    }
    /* Copy over all vars */
    newitem->type = item->type & (~cJSON_IsReference);
    newitem->valueint = item->valueint;
    newitem->valuedouble = item->valuedouble;
    if (item->valuestring)
    {
        newitem->valuestring = (char*)cJSON_strdup((unsigned char*)item->valuestring, &global_hooks);
        if (!newitem->valuestring)
        {
            goto fail;
        }
    }
    if (item->string)
    {
        newitem->string = (item->type&cJSON_StringIsConst) ? item->string : (char*)cJSON_strdup((unsigned char*)item->string, &global_hooks);
        if (!newitem->string)
        {
            goto fail;
        }
    }
    /* If non-recursive, then we're done! */
    if (!recurse)
    {
        return newitem;
    }
    /* Walk the ->next chain for the child. */
    child = item->child;
    while (child != NULL)
    {
        newchild = cJSON_Duplicate(child, true); /* Duplicate (with recurse) each item in the ->next chain */
        if (!newchild)
        {
            goto fail;
        }
        if (next != NULL)
        {
            /* If newitem->child already set, then crosswire ->prev and ->next and move on */
            next->next = newchild;
            newchild->prev = next;
            next = newchild;
        }
        else
        {
            /* Set newitem->child and move to it */
            newitem->child = newchild;
            next = newchild;
        }
        child = child->next;
    }

    return newitem;

fail:
    if (newitem != NULL)
    {
        cJSON_Delete(newitem);
    }

    return NULL;
}